

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_sse2.c
# Opt level: O0

void SharpYuvFilterRow32_SSE2
               (int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out,int bit_depth)

{
  short sVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  uint16_t uVar5;
  int max_00;
  undefined8 *puVar6;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long lVar7;
  long in_RDI;
  long in_R8;
  byte in_R9B;
  int iVar9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  int iVar11;
  int iVar12;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  int iVar13;
  undefined1 auVar10 [16];
  ushort uVar14;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar25;
  __m128i in;
  __m128i in_00;
  __m128i in_01;
  __m128i in_02;
  int v1;
  int v0;
  int a0a1b0b1_1;
  int a1b0_1;
  int a0b1_1;
  __m128i final;
  __m128i h_16;
  __m128i g;
  __m128i f1;
  __m128i f0;
  __m128i e1;
  __m128i e0;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i a1b0_2;
  __m128i a0b1_2;
  __m128i a0a1b0b1_8;
  __m128i a0a1b0b1;
  __m128i a1b0;
  __m128i a0b1;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i zero;
  __m128i max;
  __m128i kCst8;
  int i;
  int max_y;
  int local_3bc;
  short local_3b8;
  short local_368;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  short sStack_360;
  short sStack_35e;
  short sStack_35c;
  short sStack_35a;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  long lVar8;
  
  max_00 = (1 << (in_R9B & 0x1f)) + -1;
  local_3b8 = (short)max_00;
  lVar7 = in_RSI;
  lVar8 = in_RDI;
  for (local_3bc = 0; local_3bc + 4 <= in_EDX; local_3bc = local_3bc + 4) {
    in[1] = lVar7;
    in[0] = lVar8;
    s16_to_s32(in);
    in_00[1] = lVar7;
    in_00[0] = lVar8;
    s16_to_s32(in_00);
    in_01[1] = lVar7;
    in_01[0] = lVar8;
    s16_to_s32(in_01);
    in_02[1] = lVar7;
    in_02[0] = lVar8;
    s16_to_s32(in_02);
    local_1b8 = (int)extraout_XMM0_Qa;
    iStack_1b4 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
    iStack_1b0 = (int)extraout_XMM0_Qb;
    iStack_1ac = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    local_1c8 = (int)extraout_XMM0_Qa_02;
    iStack_1c4 = (int)((ulong)extraout_XMM0_Qa_02 >> 0x20);
    iStack_1c0 = (int)extraout_XMM0_Qb_02;
    iStack_1bc = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
    local_1d8 = (int)extraout_XMM0_Qa_00;
    iStack_1d4 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    iStack_1d0 = (int)extraout_XMM0_Qb_00;
    iStack_1cc = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    local_1e8 = (int)extraout_XMM0_Qa_01;
    iStack_1e4 = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
    iStack_1e0 = (int)extraout_XMM0_Qb_01;
    iStack_1dc = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
    iVar9 = local_1b8 + local_1c8 + local_1d8 + local_1e8 + 8;
    iVar11 = iStack_1b4 + iStack_1c4 + iStack_1d4 + iStack_1e4 + 8;
    iVar12 = iStack_1b0 + iStack_1c0 + iStack_1d0 + iStack_1e0 + 8;
    iVar13 = iStack_1ac + iStack_1bc + iStack_1cc + iStack_1dc + 8;
    auVar15 = ZEXT416(3);
    auVar16 = ZEXT416(3);
    auVar17 = ZEXT416(1);
    auVar18 = ZEXT416(1);
    puVar6 = (undefined8 *)(in_RCX + (long)(local_3bc << 1) * 2);
    uVar2 = *puVar6;
    uVar3 = puVar6[1];
    auVar4._4_4_ = ((local_1b8 + local_1c8) * 2 + iVar9 >> auVar15) + local_1d8 >> auVar18;
    auVar4._0_4_ = ((local_1d8 + local_1e8) * 2 + iVar9 >> auVar16) + local_1b8 >> auVar17;
    auVar4._12_4_ = ((iStack_1b4 + iStack_1c4) * 2 + iVar11 >> auVar15) + iStack_1d4 >> auVar18;
    auVar4._8_4_ = ((iStack_1d4 + iStack_1e4) * 2 + iVar11 >> auVar16) + iStack_1b4 >> auVar17;
    auVar10._4_4_ = ((iStack_1b0 + iStack_1c0) * 2 + iVar12 >> auVar15) + iStack_1d0 >> auVar18;
    auVar10._0_4_ = ((iStack_1d0 + iStack_1e0) * 2 + iVar12 >> auVar16) + iStack_1b0 >> auVar17;
    auVar10._12_4_ = ((iStack_1ac + iStack_1bc) * 2 + iVar13 >> auVar15) + iStack_1cc >> auVar18;
    auVar10._8_4_ = ((iStack_1cc + iStack_1dc) * 2 + iVar13 >> auVar16) + iStack_1ac >> auVar17;
    auVar10 = packssdw(auVar4,auVar10);
    local_358 = (short)uVar2;
    sStack_356 = (short)((ulong)uVar2 >> 0x10);
    sStack_354 = (short)((ulong)uVar2 >> 0x20);
    sStack_352 = (short)((ulong)uVar2 >> 0x30);
    sStack_350 = (short)uVar3;
    sStack_34e = (short)((ulong)uVar3 >> 0x10);
    sStack_34c = (short)((ulong)uVar3 >> 0x20);
    sStack_34a = (short)((ulong)uVar3 >> 0x30);
    local_368 = auVar10._0_2_;
    sStack_366 = auVar10._2_2_;
    sStack_364 = auVar10._4_2_;
    sStack_362 = auVar10._6_2_;
    sStack_360 = auVar10._8_2_;
    sStack_35e = auVar10._10_2_;
    sStack_35c = auVar10._12_2_;
    sStack_35a = auVar10._14_2_;
    local_358 = local_358 + local_368;
    sStack_356 = sStack_356 + sStack_366;
    sStack_354 = sStack_354 + sStack_364;
    sStack_352 = sStack_352 + sStack_362;
    sStack_350 = sStack_350 + sStack_360;
    sStack_34e = sStack_34e + sStack_35e;
    sStack_34c = sStack_34c + sStack_35c;
    sStack_34a = sStack_34a + sStack_35a;
    uVar14 = (ushort)(local_3b8 < local_358) * local_3b8 |
             (ushort)(local_3b8 >= local_358) * local_358;
    uVar19 = (ushort)(local_3b8 < sStack_356) * local_3b8 |
             (ushort)(local_3b8 >= sStack_356) * sStack_356;
    uVar20 = (ushort)(local_3b8 < sStack_354) * local_3b8 |
             (ushort)(local_3b8 >= sStack_354) * sStack_354;
    uVar21 = (ushort)(local_3b8 < sStack_352) * local_3b8 |
             (ushort)(local_3b8 >= sStack_352) * sStack_352;
    uVar22 = (ushort)(local_3b8 < sStack_350) * local_3b8 |
             (ushort)(local_3b8 >= sStack_350) * sStack_350;
    uVar23 = (ushort)(local_3b8 < sStack_34e) * local_3b8 |
             (ushort)(local_3b8 >= sStack_34e) * sStack_34e;
    uVar24 = (ushort)(local_3b8 < sStack_34c) * local_3b8 |
             (ushort)(local_3b8 >= sStack_34c) * sStack_34c;
    uVar25 = (ushort)(local_3b8 < sStack_34a) * local_3b8 |
             (ushort)(local_3b8 >= sStack_34a) * sStack_34a;
    puVar6 = (undefined8 *)(in_R8 + (long)(local_3bc << 1) * 2);
    *puVar6 = CONCAT26((-1 < (short)uVar21) * uVar21,
                       CONCAT24((-1 < (short)uVar20) * uVar20,
                                CONCAT22((-1 < (short)uVar19) * uVar19,(-1 < (short)uVar14) * uVar14
                                        )));
    puVar6[1] = CONCAT26((-1 < (short)uVar25) * uVar25,
                         CONCAT24((-1 < (short)uVar24) * uVar24,
                                  CONCAT22((-1 < (short)uVar23) * uVar23,
                                           (-1 < (short)uVar22) * uVar22)));
  }
  for (; local_3bc < in_EDX; local_3bc = local_3bc + 1) {
    iVar9 = (int)*(short *)(in_RDI + (long)local_3bc * 2) +
            (int)*(short *)(in_RSI + (long)(local_3bc + 1) * 2);
    iVar11 = (int)*(short *)(in_RDI + (long)(local_3bc + 1) * 2) +
             (int)*(short *)(in_RSI + (long)local_3bc * 2);
    iVar12 = iVar9 + iVar11 + 8;
    sVar1 = *(short *)(in_RDI + (long)(local_3bc + 1) * 2);
    uVar5 = clip_SSE2((uint)*(ushort *)(in_RCX + (long)(local_3bc << 1) * 2) +
                      (*(short *)(in_RDI + (long)local_3bc * 2) * 8 + iVar11 * 2 + iVar12 >> 4),
                      max_00);
    *(uint16_t *)(in_R8 + (long)(local_3bc << 1) * 2) = uVar5;
    uVar5 = clip_SSE2((uint)*(ushort *)(in_RCX + (long)(local_3bc * 2 + 1) * 2) +
                      (sVar1 * 8 + iVar9 * 2 + iVar12 >> 4),max_00);
    *(uint16_t *)(in_R8 + (long)(local_3bc * 2 + 1) * 2) = uVar5;
  }
  return;
}

Assistant:

static void SharpYuvFilterRow32_SSE2(const int16_t* A, const int16_t* B,
                                     int len, const uint16_t* best_y,
                                     uint16_t* out, int bit_depth) {
  const int max_y = (1 << bit_depth) - 1;
  int i;
  const __m128i kCst8 = _mm_set1_epi32(8);
  const __m128i max = _mm_set1_epi16(max_y);
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 4 <= len; i += 4) {
    const __m128i a0 = s16_to_s32(_mm_loadl_epi64((const __m128i*)(A + i + 0)));
    const __m128i a1 = s16_to_s32(_mm_loadl_epi64((const __m128i*)(A + i + 1)));
    const __m128i b0 = s16_to_s32(_mm_loadl_epi64((const __m128i*)(B + i + 0)));
    const __m128i b1 = s16_to_s32(_mm_loadl_epi64((const __m128i*)(B + i + 1)));
    const __m128i a0b1 = _mm_add_epi32(a0, b1);
    const __m128i a1b0 = _mm_add_epi32(a1, b0);
    const __m128i a0a1b0b1 = _mm_add_epi32(a0b1, a1b0);  // A0+A1+B0+B1
    const __m128i a0a1b0b1_8 = _mm_add_epi32(a0a1b0b1, kCst8);
    const __m128i a0b1_2 = _mm_add_epi32(a0b1, a0b1);  // 2*(A0+B1)
    const __m128i a1b0_2 = _mm_add_epi32(a1b0, a1b0);  // 2*(A1+B0)
    const __m128i c0 = _mm_srai_epi32(_mm_add_epi32(a0b1_2, a0a1b0b1_8), 3);
    const __m128i c1 = _mm_srai_epi32(_mm_add_epi32(a1b0_2, a0a1b0b1_8), 3);
    const __m128i d0 = _mm_add_epi32(c1, a0);
    const __m128i d1 = _mm_add_epi32(c0, a1);
    const __m128i e0 = _mm_srai_epi32(d0, 1);
    const __m128i e1 = _mm_srai_epi32(d1, 1);
    const __m128i f0 = _mm_unpacklo_epi32(e0, e1);
    const __m128i f1 = _mm_unpackhi_epi32(e0, e1);
    const __m128i g = _mm_loadu_si128((const __m128i*)(best_y + 2 * i + 0));
    const __m128i h_16 = _mm_add_epi16(g, _mm_packs_epi32(f0, f1));
    const __m128i final = _mm_max_epi16(_mm_min_epi16(h_16, max), zero);
    _mm_storeu_si128((__m128i*)(out + 2 * i + 0), final);
  }
  for (; i < len; ++i) {
    //   (9 * A0 + 3 * A1 + 3 * B0 + B1 + 8) >> 4 =
    // = (8 * A0 + 2 * (A1 + B0) + (A0 + A1 + B0 + B1 + 8)) >> 4
    // We reuse the common sub-expressions.
    const int a0b1 = A[i + 0] + B[i + 1];
    const int a1b0 = A[i + 1] + B[i + 0];
    const int a0a1b0b1 = a0b1 + a1b0 + 8;
    const int v0 = (8 * A[i + 0] + 2 * a1b0 + a0a1b0b1) >> 4;
    const int v1 = (8 * A[i + 1] + 2 * a0b1 + a0a1b0b1) >> 4;
    out[2 * i + 0] = clip_SSE2(best_y[2 * i + 0] + v0, max_y);
    out[2 * i + 1] = clip_SSE2(best_y[2 * i + 1] + v1, max_y);
  }
}